

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void nni_http_read_req(nni_http_conn *conn,nni_aio *aio)

{
  conn->res_sent = false;
  nni_http_conn_reset(conn);
  nni_mtx_lock(&conn->mtx);
  http_rd_submit(conn,aio,HTTP_RD_REQ);
  nni_mtx_unlock(&conn->mtx);
  return;
}

Assistant:

void
nni_http_read_req(nni_http_conn *conn, nni_aio *aio)
{
	// clear the sent flag (used for the server)
	conn->res_sent = false;
	nni_http_conn_reset(conn);
	nni_mtx_lock(&conn->mtx);
	http_rd_submit(conn, aio, HTTP_RD_REQ);
	nni_mtx_unlock(&conn->mtx);
}